

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_size(kvtree *hash)

{
  int iVar1;
  
  iVar1 = 0;
  if (hash != (kvtree *)0x0) {
    for (; ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next != (kvtree_elem_struct *)0x0;
        hash = (kvtree *)&((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next->pointers) {
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

int kvtree_size(const kvtree* hash)
{
  int count = 0;
  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }
  }
  return count;
}